

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XNA_Song.c
# Opt level: O1

float XNA_PlaySong(char *name)

{
  uint uVar1;
  void *pBufferContext;
  stb_vorbis *psVar2;
  FAudioWaveFormatEx format;
  FAudioWaveFormatEx local_22;
  
  XNA_SongKill();
  activeSong = stb_vorbis_open_filename(name,(int *)0x0,(stb_vorbis_alloc *)0x0);
  activeSongInfo_0 = activeSong->sample_rate;
  activeSongInfo_1 = activeSong->channels;
  local_22.wFormatTag = 3;
  local_22.nChannels = (uint16_t)activeSongInfo_1;
  local_22.wBitsPerSample = 0x20;
  local_22.cbSize = 0;
  local_22.nBlockAlign = (uint16_t)(activeSongInfo_1 << 2);
  local_22.nAvgBytesPerSec = (activeSongInfo_1 << 2 & 0xffffU) * activeSongInfo_0;
  local_22.nSamplesPerSec = activeSongInfo_0;
  songCache = (uint8_t *)SDL_malloc();
  SDL_memset(&callbacks,0,0x38);
  callbacks.OnBufferEnd = XNA_SongSubmitBuffer;
  FAudio_CreateSourceVoice
            (songAudio,&songVoice,&local_22,0,1.0,&callbacks,(FAudioVoiceSends *)0x0,
             (FAudioEffectChain *)0x0);
  FAudioVoice_SetVolume(songVoice,songVolume,0);
  psVar2 = activeSong;
  pBufferContext = (void *)(ulong)activeSong->first_audio_page_offset;
  set_file_offset(activeSong,activeSong->first_audio_page_offset);
  psVar2->previous_length = 0;
  psVar2->first_decode = '\x01';
  psVar2->next_seg = -1;
  vorbis_pump_first_frame(psVar2);
  XNA_SongSubmitBuffer((FAudioVoiceCallback *)psVar2,pBufferContext);
  FAudioSourceVoice_Start(songVoice,0,0);
  psVar2 = activeSong;
  uVar1 = stb_vorbis_stream_length_in_samples(activeSong);
  return (float)uVar1 / (float)psVar2->sample_rate;
}

Assistant:

FAUDIOAPI float XNA_PlaySong(const char *name)
{
	FAudioWaveFormatEx format;
	XNA_SongKill();

	activeSong = stb_vorbis_open_filename(name, NULL, NULL);

	/* Set format info */
	activeSongInfo = stb_vorbis_get_info(activeSong);
	format.wFormatTag = FAUDIO_FORMAT_IEEE_FLOAT;
	format.nChannels = activeSongInfo.channels;
	format.nSamplesPerSec = activeSongInfo.sample_rate;
	format.wBitsPerSample = sizeof(float) * 8;
	format.nBlockAlign = format.nChannels * format.wBitsPerSample / 8;
	format.nAvgBytesPerSec = format.nSamplesPerSec * format.nBlockAlign;
	format.cbSize = 0;

	/* Allocate decode cache */
	songCache = (uint8_t*) FAudio_malloc(format.nAvgBytesPerSec);

	/* Init voice */
	FAudio_zero(&callbacks, sizeof(FAudioVoiceCallback));
	callbacks.OnBufferEnd = XNA_SongSubmitBuffer;
	FAudio_CreateSourceVoice(
		songAudio,
		&songVoice,
		&format,
		0,
		1.0f, /* No pitch shifting here! */
		&callbacks,
		NULL,
		NULL
	);
	FAudioVoice_SetVolume(songVoice, songVolume, 0);

	/* Okay, this song is decoding now */
	stb_vorbis_seek_start(activeSong);
	XNA_SongSubmitBuffer(NULL, NULL);

	/* Finally. */
	FAudioSourceVoice_Start(songVoice, 0, 0);
	return stb_vorbis_stream_length_in_seconds(activeSong);
}